

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::GoniometricLight::Scale(GoniometricLight *this,Vector3f wl,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Point2f p;
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar11;
  WrapMode2D local_50;
  Tuple3<pbrt::Vector3,_float> local_48;
  SampledSpectrum local_38;
  SampledSpectrum local_28;
  undefined1 extraout_var [60];
  
  local_48.z = wl.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_56_ = wl._8_56_;
  auVar6._0_8_ = wl.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_48._0_8_ = vmovlps_avx(auVar6._0_16_);
  fVar4 = SafeACos(local_48.z);
  auVar7._0_4_ = SphericalPhi((Vector3f *)&local_48);
  auVar7._4_60_ = extraout_var;
  auVar1 = vinsertps_avx(auVar7._0_16_,ZEXT416((uint)fVar4),0x10);
  FVar5 = this->scale;
  auVar10 = (undefined1  [56])0x0;
  SVar11 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar8._0_8_ = SVar11.values.values._0_8_;
  auVar8._8_56_ = auVar10;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar11.values.values._8_8_;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar2);
  auVar10 = (undefined1  [56])0x0;
  SVar11 = SampledSpectrum::operator*(&local_38,FVar5);
  auVar9._0_8_ = SVar11.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = SVar11.values.values._8_8_;
  local_28.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar3);
  WrapMode2D::WrapMode2D(&local_50,Clamp);
  p.super_Tuple2<pbrt::Point2,_float>.y = auVar1._4_4_ * 0.31830987;
  p.super_Tuple2<pbrt::Point2,_float>.x = auVar1._0_4_ * 0.15915494;
  FVar5 = Image::LookupNearestChannel(&this->image,p,0,local_50);
  SVar11 = SampledSpectrum::operator*(&local_28,FVar5);
  return (array<float,_4>)(array<float,_4>)SVar11;
}

Assistant:

Scale(Vector3f wl, const SampledWavelengths &lambda) const {
        Float theta = SphericalTheta(wl), phi = SphericalPhi(wl);
        Point2f st(phi * Inv2Pi, theta * InvPi);
        return scale * I.Sample(lambda) * image.LookupNearestChannel(st, 0);
    }